

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Macintosh.cpp
# Opt level: O2

HalfCycles __thiscall
Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)0>::
perform_bus_operation<CPU::MC68000::Microcycle<321u>>
          (ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)0> *this,
          Microcycle<321U> *cycle,int param_2)

{
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  bool bVar4;
  size_t __nbytes;
  uint uVar5;
  uint32_t uVar6;
  WrappedInt<HalfCycles> duration;
  EventDelegate local_38;
  
  advance_time(this,(HalfCycles)(cycle->length).super_WrappedInt<HalfCycles>.length_);
  uVar1 = *cycle->address;
  uVar5 = uVar1 & 0xffffff;
  (this->mc68000_).super_ProcessorBase.vpa_ = 0xdfffff < uVar5;
  uVar2 = *(uint *)((long)this->memory_map_ + (ulong)(uVar1 >> 0xf & 0x1fc));
  if (8 < (ulong)uVar2) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Apple/Macintosh/Macintosh.cpp"
                  ,0xe4,
                  "HalfCycles Apple::Macintosh::ConcreteMachine<Analyser::Static::Macintosh::Target::Model::Mac128k>::perform_bus_operation(const Microcycle &, int) [model = Analyser::Static::Macintosh::Target::Model::Mac128k, Microcycle = CPU::MC68000::Microcycle<321>]"
                 );
  }
  __nbytes = (long)&switchD_0028c513::switchdataD_0045132c +
             (long)(int)(&switchD_0028c513::switchdataD_0045132c)[uVar2];
  switch(uVar2) {
  case 0:
    uVar6 = this->ram_mask_;
    if (uVar6 - 0xd900 < (uVar5 ^ 1)) {
      update_video(this);
      uVar6 = this->ram_mask_;
    }
    puVar3 = (this->ram_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    bVar4 = video_is_outputting(this);
    if ((bVar4) && (this->ram_subcycle_ < 8)) {
      duration.length_._0_4_ = 8 - this->ram_subcycle_;
      duration.length_._4_4_ = 0;
      advance_time(this,(HalfCycles)duration.length_);
    }
    else {
      duration.length_ = 0;
    }
    puVar3[uVar6 & (uVar5 ^ 1)] = (cycle->value->field_1).b;
    return (HalfCycles)(WrappedInt<HalfCycles>)duration.length_;
  case 2:
    if ((uVar1 & 1) == 0) {
      MOS::MOS6522::
      MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)0>::VIAPortHandler>
      ::write(&this->via_,uVar5 >> 9,(void *)(ulong)(cycle->value->field_1).b,__nbytes);
    }
    break;
  case 3:
    if ((uVar1 & 1) != 0) {
      JustInTimeActor<Apple::IWM,_HalfCycles,_1,_1>::operator->
                ((JustInTimeActor<Apple::IWM,_HalfCycles,_1,_1> *)&stack0xffffffffffffffc0);
      IWM::write((IWM *)local_38._vptr_EventDelegate,uVar5 >> 9,
                 (void *)(ulong)(cycle->value->field_1).b,__nbytes);
    }
    break;
  case 4:
    if ((uVar1 & 1) != 0) {
      Zilog::SCC::z8530::write
                (&this->scc_,uVar5 >> 1,(void *)(ulong)(cycle->value->field_1).b,__nbytes);
    }
    break;
  case 5:
    if ((uVar1 & 1) == 0) {
      Zilog::SCC::z8530::read
                (&this->scc_,uVar5 >> 1,&switchD_0028c513::switchdataD_0045132c,__nbytes);
    }
    else {
      Zilog::SCC::z8530::reset(&this->scc_);
    }
    break;
  case 6:
    if ((uVar1 & 1) != 0) {
      NCR::NCR5380::NCR5380::write
                (&this->scsi_,uVar5 >> 4,(void *)(ulong)(cycle->value->field_1).b,0);
      return (HalfCycles)0;
    }
  }
  return (HalfCycles)0;
}

Assistant:

HalfCycles perform_bus_operation(const Microcycle &cycle, int) {
			// Advance time.
			advance_time(cycle.length);

			// A null cycle leaves nothing else to do.
			if(!(cycle.operation & (CPU::MC68000::Operation::NewAddress | CPU::MC68000::Operation::SameAddress))) return HalfCycles(0);

			// Grab the address.
			auto address = cycle.host_endian_byte_address();

			// Everything above E0 0000 is signalled as being on the peripheral bus.
			//
			// This will also act to autovector interrupts, since an interrupt acknowledge
			// cycle posts an address with all the higher-order bits set, and VPA doubles
			// as the input to request an autovector.
			mc68000_.set_is_peripheral_address(address >= 0xe0'0000);

			// All code below deals only with reads and writes — cycles in which a
			// data select is active. So quit now if this is not the active part of
			// a read or write.
			//
			// The 68000 uses 6800-style autovectored interrupts, so the mere act of
			// having set VPA above deals with those given that the generated address
			// for interrupt acknowledge cycles always has all bits set except the
			// lowest explicit address lines.
			if(
				!cycle.data_select_active() ||
				(cycle.operation & CPU::MC68000::Operation::InterruptAcknowledge)
			) return HalfCycles(0);

			// Grab the word-precision address being accessed.
			uint8_t *memory_base = nullptr;
			HalfCycles delay;
			switch(memory_map_[address >> 17]) {
				default: assert(false);

				case BusDevice::Unassigned:
					fill_unmapped(cycle);
				return delay;

				case BusDevice::VIA: {
					if(*cycle.address & 1) {
						fill_unmapped(cycle);
					} else {
						const int register_address = address >> 9;

						// VIA accesses are via address 0xefe1fe + register*512,
						// which at word precision is 0x77f0ff + register*256.
						if(cycle.operation & CPU::MC68000::Operation::Read) {
							cycle.set_value8_high(via_.read(register_address));
						} else {
							via_.write(register_address, cycle.value8_high());
						}
					}
				} return delay;

				case BusDevice::PhaseRead: {
					if(cycle.operation & CPU::MC68000::Operation::Read) {
						cycle.set_value8_low(phase_ & 7);
					}
				} return delay;

				case BusDevice::IWM: {
					if(*cycle.address & 1) {
						const int register_address = address >> 9;

						// The IWM; this is a purely polled device, so can be run on demand.
						if(cycle.operation & CPU::MC68000::Operation::Read) {
							cycle.set_value8_low(iwm_->read(register_address));
						} else {
							iwm_->write(register_address, cycle.value8_low());
						}
					} else {
						fill_unmapped(cycle);
					}
				} return delay;

				case BusDevice::SCSI: {
					const int register_address = address >> 4;
					const bool dma_acknowledge = address & 0x200;

					// Even accesses = read; odd = write.
					if(*cycle.address & 1) {
						// Odd access => this is a write. Data will be in the upper byte.
						if(cycle.operation & CPU::MC68000::Operation::Read) {
							scsi_.write(register_address, 0xff, dma_acknowledge);
						} else {
							scsi_.write(register_address, cycle.value8_high());
						}
					} else {
						// Even access => this is a read.
						if(cycle.operation & CPU::MC68000::Operation::Read) {
							cycle.set_value8_high(scsi_.read(register_address, dma_acknowledge));
						}
					}
				} return delay;

				case BusDevice::SCCReadResetPhase: {
					// Any word access here adjusts phase.
					if(cycle.operation & CPU::MC68000::Operation::SelectWord) {
						adjust_phase();
					} else {
						// A0 = 1 => reset; A0 = 0 => read.
						if(*cycle.address & 1) {
							scc_.reset();

							if(cycle.operation & CPU::MC68000::Operation::Read) {
								cycle.set_value16(0xffff);
							}
						} else {
							const auto read = scc_.read(int(address >> 1));
							if(cycle.operation & CPU::MC68000::Operation::Read) {
								cycle.set_value8_high(read);
							}
						}
					}
				} return delay;

				case BusDevice::SCCWrite: {
					// Any word access here adjusts phase.
					if(cycle.operation & CPU::MC68000::Operation::SelectWord) {
						adjust_phase();
					} else {
						// This is definitely a byte access; either it's to an odd address, in which
						// case it will reach the SCC, or it isn't, in which case it won't.
						if(*cycle.address & 1) {
							if(cycle.operation & CPU::MC68000::Operation::Read) {
								scc_.write(int(address >> 1), 0xff);
								cycle.value->b = 0xff;
							} else {
								scc_.write(int(address >> 1), cycle.value->b);
							}
						} else {
							fill_unmapped(cycle);
						}
					}
				} return delay;

				case BusDevice::RAM: {
					// This is coupled with the Macintosh implementation of video; the magic
					// constant should probably be factored into the Video class.
					// It embodies knowledge of the fact that video (and audio) will always
					// be fetched from the final $d900 bytes of memory.
					// (And that ram_mask_ = ram size - 1).
					if(address > ram_mask_ - 0xd900)
						update_video();

					memory_base = ram_.data();
					address &= ram_mask_;

					// Apply a delay due to video contention if applicable; scheme applied:
					// only every other access slot is available during the period of video
					// output. I believe this to be correct for the 128k, 512k and Plus.
					// More research to do on other models.
					if(video_is_outputting() && ram_subcycle_ < 8) {
						delay = HalfCycles(8 - ram_subcycle_);
						advance_time(delay);
					}
				} break;

				case BusDevice::ROM: {
					if(!(cycle.operation & CPU::MC68000::Operation::Read)) return delay;
					memory_base = rom_;
					address &= rom_mask_;
				} break;
			}

			// If control has fallen through to here, the access is either a read from ROM, or a read or write to RAM.
			// Potential writes to ROM and all hardware accesses have already been weeded out.
			cycle.apply(&memory_base[address]);

			return delay;
		}